

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev.c
# Opt level: O2

void child_reap(ev_loop *loop,int chain,int pid,int status)

{
  WL w;
  WL *ppeVar1;
  
  ppeVar1 = childs;
  while (w = *ppeVar1, w != (WL)0x0) {
    if ((w[1].pending == chain || w[1].pending == 0) &&
       ((pid != 0xffff && (char)pid != '\x7f' || ((w[1].active & 1) != 0)))) {
      w->priority = 2;
      w[1].priority = chain;
      *(int *)&w[1].field_0xc = pid;
      ev_feed_event(loop,w,0x800);
    }
    ppeVar1 = &w->next;
  }
  return;
}

Assistant:

inline_speed void
child_reap (EV_P_ int chain, int pid, int status)
{
  ev_child *w;
  int traced = WIFSTOPPED (status) || WIFCONTINUED (status);

  for (w = (ev_child *)childs [chain & ((EV_PID_HASHSIZE) - 1)]; w; w = (ev_child *)((WL)w)->next)
    {
      if ((w->pid == pid || !w->pid)
          && (!traced || (w->flags & 1)))
        {
          ev_set_priority (w, EV_MAXPRI); /* need to do it *now*, this *must* be the same prio as the signal watcher itself */
          w->rpid    = pid;
          w->rstatus = status;
          ev_feed_event (EV_A_ (W)w, EV_CHILD);
        }
    }
}